

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

IEventListenerPtr
Catch::anon_unknown_26::createReporter(string *reporterName,ReporterConfig *config)

{
  int iVar1;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar2;
  undefined4 extraout_var;
  IEventListenerPtr IVar3;
  ReusableStringStream RStack_48;
  string local_38;
  
  pSVar2 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar1 = (*(pSVar2->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar2);
  IVar3 = ReporterRegistry::create
                    ((ReporterRegistry *)reporterName,(string *)CONCAT44(extraout_var,iVar1),config)
  ;
  if ((reporterName->_M_dataplus)._M_p != (pointer)0x0) {
    return (IEventListenerPtr)IVar3.m_ptr;
  }
  ReusableStringStream::ReusableStringStream(&RStack_48);
  std::__ostream_insert<char,std::char_traits<char>>
            (RStack_48.m_oss,"No reporter registered with name: \'",0x23);
  std::__ostream_insert<char,std::char_traits<char>>
            (RStack_48.m_oss,(char *)(config->m_stream).m_ptr,(long)config->m_fullConfig);
  local_38._M_dataplus._M_p._0_1_ = 0x27;
  std::__ostream_insert<char,std::char_traits<char>>(RStack_48.m_oss,(char *)&local_38,1);
  std::__cxx11::stringbuf::str();
  throw_domain_error(&local_38);
}

Assistant:

IEventListenerPtr createReporter(std::string const& reporterName, ReporterConfig&& config) {
            auto reporter = Catch::getRegistryHub().getReporterRegistry().create(reporterName, CATCH_MOVE(config));
            CATCH_ENFORCE(reporter, "No reporter registered with name: '" << reporterName << '\'');

            return reporter;
        }